

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib659.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  CURLU *urlp;
  CURLcode res;
  CURL *handle;
  char *URL_local;
  
  urlp._4_4_ = 0;
  _ec_1 = 0;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                  ,0x26,iVar2,uVar3);
    urlp._4_4_ = iVar2;
  }
  if (urlp._4_4_ == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                    ,0x27);
      urlp._4_4_ = 0x7c;
    }
    if (urlp._4_4_ == 0) {
      _ec_1 = curl_url();
      if (_ec_1 == 0) {
        curl_mfprintf(_stderr,"problem init URL api.");
      }
      else {
        iVar2 = curl_url_set(_ec_1,5,"www.example.com",0);
        if (((iVar2 == 0) && (iVar2 = curl_url_set(_ec_1,1,"http",0), iVar2 == 0)) &&
           (iVar2 = curl_url_set(_ec_1,6,"80",0), iVar2 == 0)) {
          iVar2 = curl_easy_setopt(lVar4,0x282a,_ec_1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                          ,0x38,iVar2,uVar3);
            urlp._4_4_ = iVar2;
          }
          if (urlp._4_4_ == 0) {
            iVar2 = curl_easy_setopt(lVar4,0x29,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                            ,0x39,iVar2,uVar3);
              urlp._4_4_ = iVar2;
            }
            if (urlp._4_4_ == 0) {
              iVar2 = curl_easy_setopt(lVar4,0x2714,URL);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                              ,0x3a,iVar2,uVar3);
                urlp._4_4_ = iVar2;
              }
              if ((urlp._4_4_ == 0) &&
                 (urlp._4_4_ = curl_easy_perform(lVar4), uVar1 = _stderr, urlp._4_4_ != 0)) {
                uVar3 = curl_easy_strerror(urlp._4_4_);
                curl_mfprintf(uVar1,"%s:%d curl_easy_perform() failed with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                              ,0x40,urlp._4_4_,uVar3);
              }
            }
          }
        }
        else {
          curl_mfprintf(_stderr,"problem setting CURLUPART");
        }
      }
    }
    curl_url_cleanup(_ec_1);
    curl_easy_cleanup(lVar4);
    curl_global_cleanup();
    URL_local._4_4_ = urlp._4_4_;
  }
  else {
    URL_local._4_4_ = urlp._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLcode res = 0;
  CURLU *urlp = NULL;

  global_init(CURL_GLOBAL_ALL);
  easy_init(handle);

  urlp = curl_url();

  if(!urlp) {
    fprintf(stderr, "problem init URL api.");
    goto test_cleanup;
  }

  /* this doesn't set the PATH part */
  if(curl_url_set(urlp, CURLUPART_HOST, "www.example.com", 0) ||
     curl_url_set(urlp, CURLUPART_SCHEME, "http", 0) ||
     curl_url_set(urlp, CURLUPART_PORT, "80", 0)) {
    fprintf(stderr, "problem setting CURLUPART");
    goto test_cleanup;
  }

  easy_setopt(handle, CURLOPT_CURLU, urlp);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);
  easy_setopt(handle, CURLOPT_PROXY, URL);

  res = curl_easy_perform(handle);

  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

test_cleanup:

  curl_url_cleanup(urlp);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}